

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::setCallback(Highs *this,HighsCallbackFunctionType *user_callback,void *user_callback_data)

{
  HighsCallback *this_00;
  
  this_00 = &this->callback_;
  HighsCallback::clear(this_00);
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::operator=(&this_00->user_callback,user_callback);
  (this->callback_).user_callback_data = user_callback_data;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::operator=(&(this->options_).super_HighsOptionsStruct.log_options.user_callback,
              &this_00->user_callback);
  (this->options_).super_HighsOptionsStruct.log_options.user_callback_data =
       (this->callback_).user_callback_data;
  (this->options_).super_HighsOptionsStruct.log_options.user_callback_active = false;
  return kOk;
}

Assistant:

HighsStatus Highs::setCallback(HighsCallbackFunctionType user_callback,
                               void* user_callback_data) {
  this->callback_.clear();
  this->callback_.user_callback = user_callback;
  this->callback_.user_callback_data = user_callback_data;

  options_.log_options.user_callback = this->callback_.user_callback;
  options_.log_options.user_callback_data = this->callback_.user_callback_data;
  options_.log_options.user_callback_active = false;
  return HighsStatus::kOk;
}